

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JITTimeProfileInfo.cpp
# Opt level: O0

LoopFlags __thiscall JITTimeProfileInfo::GetLoopFlags(JITTimeProfileInfo *this,uint loopNum)

{
  code *pcVar1;
  bool bVar2;
  LoopFlags LVar3;
  BVFixed *pBVar4;
  undefined4 *puVar5;
  uint loopNum_local;
  JITTimeProfileInfo *this_local;
  
  pBVar4 = GetLoopFlags(this);
  if (pBVar4 == (BVFixed *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITTimeProfileInfo.cpp"
                       ,0x12a,"(GetLoopFlags() != nullptr)","GetLoopFlags() != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pBVar4 = GetLoopFlags(this);
  LVar3 = BVFixed::GetRange<Js::LoopFlags>(pBVar4,loopNum << 1,2);
  return LVar3;
}

Assistant:

Js::LoopFlags
JITTimeProfileInfo::GetLoopFlags(uint loopNum) const
{
    Assert(GetLoopFlags() != nullptr);
    return GetLoopFlags()->GetRange<Js::LoopFlags>(loopNum * Js::LoopFlags::COUNT, Js::LoopFlags::COUNT);
}